

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void codebinexpval(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2,int line)

{
  int iVar1;
  int b;
  
  iVar1 = luaK_exp2RK(fs,e2);
  b = luaK_exp2RK(fs,e1);
  freeexps(fs,e1,e2);
  iVar1 = luaK_codeABC(fs,op,0,b,iVar1);
  (e1->u).info = iVar1;
  e1->k = VRELOCABLE;
  fs->f->lineinfo[(long)fs->pc + -1] = line;
  return;
}

Assistant:

static void codebinexpval(FuncState *fs, OpCode op,
                          expdesc *e1, expdesc *e2, int line) {
    int rk2 = luaK_exp2RK(fs, e2);  /* both operands are "RK" */
    int rk1 = luaK_exp2RK(fs, e1);
    freeexps(fs, e1, e2);
    e1->u.info = luaK_codeABC(fs, op, 0, rk1, rk2);  /* generate opcode */
    e1->k = VRELOCABLE;  /* all those operations are relocatable */
    luaK_fixline(fs, line);
}